

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_yaml.cpp
# Opt level: O2

void Omega_h::yaml::build_productions
               (vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
                *prods)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_25;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_27;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_28;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_29;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_30;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_31;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_32;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_33;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_34;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_35;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_36;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_37;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_38;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_39;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_40;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_41;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_42;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_43;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_44;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_45;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_46;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_47;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_48;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_49;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_50;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_51;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_52;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_53;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_54;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_55;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_56;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_57;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_58;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_59;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_60;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_61;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_62;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_63;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_64;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_65;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_66;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_67;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_68;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_69;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_70;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_71;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_72;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_73;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_74;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_75;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_76;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_77;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_78;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_79;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_80;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_81;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_82;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_83;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_84;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_85;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_86;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_87;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_88;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_89;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_90;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_91;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_92;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_93;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_94;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_95;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_96;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_97;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_98;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_99;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_x00100;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_x00101;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_x00102;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_x00103;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_x00104;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_x00105;
  allocator_type local_127;
  allocator local_126;
  allocator local_125;
  allocator_type local_124;
  allocator_type local_123;
  allocator_type local_122;
  allocator local_121;
  Production local_120;
  allocator_type local_e1;
  undefined1 local_e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::resize
            (prods,0x76);
  std::__cxx11::string::string((string *)local_e0,"doc",&local_125);
  std::__cxx11::string::string((string *)&local_120,"top_items",&local_126);
  __l._M_len = 1;
  __l._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"doc",&local_125);
  std::__cxx11::string::string((string *)local_e0,"NEWLINE",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"top_items",(allocator *)&local_127);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_00,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"top_items",&local_125);
  std::__cxx11::string::string((string *)&local_120,"top_item",&local_126);
  __l_01._M_len = 1;
  __l_01._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_01,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"top_items",&local_125);
  std::__cxx11::string::string((string *)local_e0,"top_items",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"top_item",(allocator *)&local_127);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_02,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 3,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"top_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"%",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"any*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"NEWLINE",(allocator *)&local_124);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_03,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 4,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"top_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"-",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"-",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"NEWLINE",(allocator *)&local_123);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_04,&local_122);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 5,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"top_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,".",&local_126);
  std::__cxx11::string::string((string *)&local_c0,".",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,".",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"NEWLINE",(allocator *)&local_123);
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_05,&local_122);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 6,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"top_item",&local_125);
  std::__cxx11::string::string((string *)&local_120,"bmap_item",&local_126);
  __l_06._M_len = 1;
  __l_06._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_06,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 7,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"bmap_items",&local_125);
  std::__cxx11::string::string((string *)&local_120,"bmap_item",&local_126);
  __l_07._M_len = 1;
  __l_07._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_07,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 8,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"bmap_items",&local_125);
  std::__cxx11::string::string((string *)local_e0,"bmap_items",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bmap_item",(allocator *)&local_127);
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_08,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 9,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bmap_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_126);
  std::__cxx11::string::string((string *)&local_c0,":",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"tag?",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"map_scalar",(allocator *)&local_122);
  std::__cxx11::string::string(local_40,"NEWLINE",&local_121);
  __l_09._M_len = 6;
  __l_09._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_09,&local_e1);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 10,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bmap_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_126);
  std::__cxx11::string::string((string *)&local_c0,":",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"bscalar",(allocator *)&local_123);
  __l_10._M_len = 4;
  __l_10._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_10,&local_122);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xb,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bmap_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_126);
  std::__cxx11::string::string((string *)&local_c0,":",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"NEWLINE",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"bvalue",(allocator *)&local_122);
  __l_11._M_len = 5;
  __l_11._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_11,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xc,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"bvalue",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xd,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"bvalue",&local_125);
  std::__cxx11::string::string((string *)local_e0,"INDENT",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bmap_items",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"DEDENT",(allocator *)&local_124);
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_12,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xe,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bvalue",&local_125);
  std::__cxx11::string::string((string *)local_e0,"INDENT",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bseq_items",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"DEDENT",(allocator *)&local_124);
  __l_13._M_len = 3;
  __l_13._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_13,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xf,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bmap_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_126);
  std::__cxx11::string::string((string *)&local_c0,":",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"tag?",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"fmap",(allocator *)&local_122);
  std::__cxx11::string::string(local_40,"NEWLINE",&local_121);
  __l_14._M_len = 6;
  __l_14._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_14,&local_e1);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x10,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bmap_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_126);
  std::__cxx11::string::string((string *)&local_c0,":",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"tag?",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"fseq",(allocator *)&local_122);
  std::__cxx11::string::string(local_40,"NEWLINE",&local_121);
  __l_15._M_len = 6;
  __l_15._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_15,&local_e1);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x11,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"bseq_items",&local_125);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_126);
  __l_16._M_len = 1;
  __l_16._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_16,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x12,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"bseq_items",&local_125);
  std::__cxx11::string::string((string *)local_e0,"bseq_items",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bseq_item",(allocator *)&local_127);
  __l_17._M_len = 2;
  __l_17._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_17,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x13,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS+",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"tag?",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"scalar",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"NEWLINE",(allocator *)&local_122);
  __l_18._M_len = 5;
  __l_18._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_18,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x14,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS+",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"bscalar",(allocator *)&local_124);
  __l_19._M_len = 3;
  __l_19._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_19,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x15,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"NEWLINE",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"INDENT",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"bmap_items",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"DEDENT",(allocator *)&local_122);
  __l_20._M_len = 5;
  __l_20._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_20,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x16,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS+",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"NEWLINE",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"INDENT",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"bmap_items",(allocator *)&local_122);
  std::__cxx11::string::string(local_40,"DEDENT",&local_121);
  __l_21._M_len = 6;
  __l_21._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_21,&local_e1);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x17,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"NEWLINE",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"INDENT",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"bseq_items",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"DEDENT",(allocator *)&local_122);
  __l_22._M_len = 5;
  __l_22._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_22,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x18,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS+",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"NEWLINE",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"INDENT",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"bseq_items",(allocator *)&local_122);
  std::__cxx11::string::string(local_40,"DEDENT",&local_121);
  __l_23._M_len = 6;
  __l_23._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_23,&local_e1);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x19,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS+",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"tag?",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"fmap",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"NEWLINE",(allocator *)&local_122);
  __l_24._M_len = 5;
  __l_24._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_24,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1a,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS+",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"tag?",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"fseq",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"NEWLINE",(allocator *)&local_122);
  __l_25._M_len = 5;
  __l_25._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_25,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1b,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fmap",&local_125);
  std::__cxx11::string::string((string *)local_e0,"{",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"fmap_items",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"}",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"WS*",(allocator *)&local_122);
  __l_26._M_len = 5;
  __l_26._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_26,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1c,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fmap",&local_125);
  std::__cxx11::string::string((string *)local_e0,"{",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"}",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"WS*",(allocator *)&local_123);
  __l_27._M_len = 4;
  __l_27._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_27,&local_122);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1d,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"fmap_items",&local_125);
  std::__cxx11::string::string((string *)&local_120,"fmap_item",&local_126);
  __l_28._M_len = 1;
  __l_28._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_28,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1e,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"fmap_items",&local_125);
  std::__cxx11::string::string((string *)local_e0,"fmap_items",&local_126);
  std::__cxx11::string::string((string *)&local_c0,",",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"fmap_item",(allocator *)&local_123);
  __l_29._M_len = 4;
  __l_29._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_29,&local_122);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x1f,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fmap_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_126);
  std::__cxx11::string::string((string *)&local_c0,":",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"tag?",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"scalar",(allocator *)&local_122);
  __l_30._M_len = 5;
  __l_30._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_30,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x20,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fmap_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_126);
  std::__cxx11::string::string((string *)&local_c0,":",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"tag?",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"fmap",(allocator *)&local_122);
  __l_31._M_len = 5;
  __l_31._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_31,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x21,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fmap_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_126);
  std::__cxx11::string::string((string *)&local_c0,":",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"tag?",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"fseq",(allocator *)&local_122);
  __l_32._M_len = 5;
  __l_32._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_32,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x22,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fseq",&local_125);
  std::__cxx11::string::string((string *)local_e0,"[",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"fseq_items",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"]",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"WS*",(allocator *)&local_122);
  __l_33._M_len = 5;
  __l_33._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_33,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x23,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fseq",&local_125);
  std::__cxx11::string::string((string *)local_e0,"[",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"]",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"WS*",(allocator *)&local_123);
  __l_34._M_len = 4;
  __l_34._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_34,&local_122);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x24,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"fseq_items",&local_125);
  std::__cxx11::string::string((string *)&local_120,"fseq_item",&local_126);
  __l_35._M_len = 1;
  __l_35._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_35,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x25,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"fseq_items",&local_125);
  std::__cxx11::string::string((string *)local_e0,"fseq_items",&local_126);
  std::__cxx11::string::string((string *)&local_c0,",",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"WS*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"fseq_item",(allocator *)&local_123);
  __l_36._M_len = 4;
  __l_36._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_36,&local_122);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x26,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"tag?",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"scalar",(allocator *)&local_127);
  __l_37._M_len = 2;
  __l_37._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_37,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x27,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"tag?",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"fmap",(allocator *)&local_127);
  __l_38._M_len = 2;
  __l_38._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_38,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x28,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"fseq_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"tag?",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"fseq",(allocator *)&local_127);
  __l_39._M_len = 2;
  __l_39._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_39,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x29,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"scalar",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar_head",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"scalar_tail*",(allocator *)&local_127);
  __l_40._M_len = 2;
  __l_40._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_40,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2a,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"scalar",&local_125);
  std::__cxx11::string::string((string *)&local_120,"scalar_quoted",&local_126);
  __l_41._M_len = 1;
  __l_41._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_41,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2b,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"map_scalar",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar_head",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"scalar_tail*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"map_scalar_escaped*",(allocator *)&local_124);
  __l_42._M_len = 3;
  __l_42._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_42,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2c,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"map_scalar",&local_125);
  std::__cxx11::string::string((string *)&local_120,"scalar_quoted",&local_126);
  __l_43._M_len = 1;
  __l_43._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_43,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2d,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"scalar_quoted",&local_125);
  std::__cxx11::string::string((string *)local_e0,"\"",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"dquoted*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"descape*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"\"",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"WS*",(allocator *)&local_122);
  __l_44._M_len = 5;
  __l_44._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_44,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2e,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"scalar_quoted",&local_125);
  std::__cxx11::string::string((string *)local_e0,"\'",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"squoted*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"sescape*",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"\'",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"WS*",(allocator *)&local_122);
  __l_45._M_len = 5;
  __l_45._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_45,(allocator_type *)&local_121);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x2f,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"scalar_head",&local_125);
  std::__cxx11::string::string((string *)&local_120,"OTHERCHAR",&local_126);
  __l_46._M_len = 1;
  __l_46._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_46,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x30,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"scalar_head",&local_125);
  std::__cxx11::string::string((string *)local_e0,".",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"OTHERCHAR",(allocator *)&local_127);
  __l_47._M_len = 2;
  __l_47._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_47,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x31,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"scalar_head",&local_125);
  std::__cxx11::string::string((string *)local_e0,"-",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"OTHERCHAR",(allocator *)&local_127);
  __l_48._M_len = 2;
  __l_48._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_48,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x32,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"scalar_head",&local_125);
  std::__cxx11::string::string((string *)local_e0,".",&local_126);
  std::__cxx11::string::string((string *)&local_c0,".",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"OTHERCHAR",(allocator *)&local_124);
  __l_49._M_len = 3;
  __l_49._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_49,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x33,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"map_scalar_escaped*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x34,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"map_scalar_escaped*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"map_scalar_escaped*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,",",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"scalar_tail*",(allocator *)&local_124);
  __l_50._M_len = 3;
  __l_50._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_50,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x35,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"tag?",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x36,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"tag?",&local_125);
  std::__cxx11::string::string((string *)local_e0,"!",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"!",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"OTHERCHAR+",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"WS+",(allocator *)&local_123);
  __l_51._M_len = 4;
  __l_51._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_51,&local_122);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x37,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bscalar",&local_125);
  std::__cxx11::string::string((string *)local_e0,"bscalar_header",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS*",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"NEWLINE",(allocator *)&local_124);
  std::__cxx11::string::string(local_80,"INDENT",(allocator *)&local_123);
  std::__cxx11::string::string(local_60,"bscalar_items",(allocator *)&local_122);
  std::__cxx11::string::string(local_40,"DEDENT",&local_121);
  __l_52._M_len = 6;
  __l_52._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_52,&local_e1);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x38,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"bscalar_items",&local_125);
  std::__cxx11::string::string((string *)&local_120,"bscalar_item",&local_126);
  __l_53._M_len = 1;
  __l_53._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_53,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x39,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"bscalar_items",&local_125);
  std::__cxx11::string::string((string *)local_e0,"bscalar_items",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bscalar_item",(allocator *)&local_127);
  __l_54._M_len = 2;
  __l_54._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_54,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3a,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bscalar_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"any*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"NEWLINE",(allocator *)&local_127);
  __l_55._M_len = 2;
  __l_55._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_55,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3b,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bscalar_item",&local_125);
  std::__cxx11::string::string((string *)local_e0,"INDENT",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bscalar_items",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"DEDENT",(allocator *)&local_124);
  __l_56._M_len = 3;
  __l_56._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_56,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3c,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bscalar_header",&local_125);
  std::__cxx11::string::string((string *)local_e0,"|",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bscalar_head_c*",(allocator *)&local_127);
  __l_57._M_len = 2;
  __l_57._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_57,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3d,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"bscalar_header",&local_125);
  std::__cxx11::string::string((string *)local_e0,">",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bscalar_head_c*",(allocator *)&local_127);
  __l_58._M_len = 2;
  __l_58._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_58,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3e,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"bscalar_head_c*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x3f,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"bscalar_head_c*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"bscalar_head_c*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"bscalar_head_c",(allocator *)&local_127);
  __l_59._M_len = 2;
  __l_59._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_59,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x40,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"bscalar_head_c",&local_125);
  std::__cxx11::string::string((string *)&local_120,"OTHERCHAR",&local_126);
  __l_60._M_len = 1;
  __l_60._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_60,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x41,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"bscalar_head_c",&local_125);
  std::__cxx11::string::string((string *)&local_120,"-",&local_126);
  __l_61._M_len = 1;
  __l_61._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_61,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x42,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"dquoted*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x43,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"dquoted*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"dquoted*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"dquoted",(allocator *)&local_127);
  __l_62._M_len = 2;
  __l_62._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_62,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x44,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"squoted*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x45,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"squoted*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"squoted*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"squoted",(allocator *)&local_127);
  __l_63._M_len = 2;
  __l_63._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_63,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x46,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"any*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x47,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"any*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"any*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"any",(allocator *)&local_127);
  __l_64._M_len = 2;
  __l_64._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_64,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x48,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"descape*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x49,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"descape*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"descape*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"descape",(allocator *)&local_127);
  __l_65._M_len = 2;
  __l_65._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_65,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4a,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"descape",&local_125);
  std::__cxx11::string::string((string *)local_e0,"\\",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"descaped",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"dquoted*",(allocator *)&local_124);
  __l_66._M_len = 3;
  __l_66._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_66,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4b,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"sescape*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4c,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"sescape*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"sescape*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"sescape",(allocator *)&local_127);
  __l_67._M_len = 2;
  __l_67._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_67,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4d,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_120,"sescape",&local_125);
  std::__cxx11::string::string((string *)local_e0,"\'",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"\'",(allocator *)&local_127);
  std::__cxx11::string::string(local_a0,"squoted*",(allocator *)&local_124);
  __l_68._M_len = 3;
  __l_68._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_68,&local_123);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4e,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"scalar_tail*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x4f,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"scalar_tail*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"scalar_tail*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"scalar_tail",(allocator *)&local_127);
  __l_69._M_len = 2;
  __l_69._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_69,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x50,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"OTHERCHAR+",&local_125);
  std::__cxx11::string::string((string *)&local_120,"OTHERCHAR",&local_126);
  __l_70._M_len = 1;
  __l_70._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_70,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x51,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"OTHERCHAR+",&local_125);
  std::__cxx11::string::string((string *)local_e0,"OTHERCHAR+",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"OTHERCHAR",(allocator *)&local_127);
  __l_71._M_len = 2;
  __l_71._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_71,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x52,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"scalar_tail",&local_125);
  std::__cxx11::string::string((string *)&local_120,"WS",&local_126);
  __l_72._M_len = 1;
  __l_72._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_72,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x53,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"scalar_tail",&local_125);
  std::__cxx11::string::string((string *)&local_120,".",&local_126);
  __l_73._M_len = 1;
  __l_73._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_73,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x54,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"scalar_tail",&local_125);
  std::__cxx11::string::string((string *)&local_120,"-",&local_126);
  __l_74._M_len = 1;
  __l_74._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_74,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x55,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"scalar_tail",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\'",&local_126);
  __l_75._M_len = 1;
  __l_75._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_75,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x56,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"scalar_tail",&local_125);
  std::__cxx11::string::string((string *)&local_120,"OTHERCHAR",&local_126);
  __l_76._M_len = 1;
  __l_76._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_76,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x57,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"descaped",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\"",&local_126);
  __l_77._M_len = 1;
  __l_77._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_77,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x58,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"descaped",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\\",&local_126);
  __l_78._M_len = 1;
  __l_78._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_78,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x59,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"descaped",&local_125);
  std::__cxx11::string::string((string *)&local_120,"dquoted",&local_126);
  __l_79._M_len = 1;
  __l_79._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_79,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5a,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"dquoted",&local_125);
  std::__cxx11::string::string((string *)&local_120,"common",&local_126);
  __l_80._M_len = 1;
  __l_80._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_80,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5b,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"dquoted",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\'",&local_126);
  __l_81._M_len = 1;
  __l_81._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_81,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5c,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"squoted",&local_125);
  std::__cxx11::string::string((string *)&local_120,"common",&local_126);
  __l_82._M_len = 1;
  __l_82._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_82,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5d,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"squoted",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\"",&local_126);
  __l_83._M_len = 1;
  __l_83._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_83,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5e,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"squoted",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\\",&local_126);
  __l_84._M_len = 1;
  __l_84._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_84,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x5f,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"any",&local_125);
  std::__cxx11::string::string((string *)&local_120,"common",&local_126);
  __l_85._M_len = 1;
  __l_85._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_85,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x60,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"any",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\"",&local_126);
  __l_86._M_len = 1;
  __l_86._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_86,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x61,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"any",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\'",&local_126);
  __l_87._M_len = 1;
  __l_87._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_87,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x62,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"any",&local_125);
  std::__cxx11::string::string((string *)&local_120,"\\",&local_126);
  __l_88._M_len = 1;
  __l_88._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_88,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 99,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"WS",&local_126);
  __l_89._M_len = 1;
  __l_89._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_89,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 100,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,":",&local_126);
  __l_90._M_len = 1;
  __l_90._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_90,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x65,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,".",&local_126);
  __l_91._M_len = 1;
  __l_91._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_91,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x66,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"-",&local_126);
  __l_92._M_len = 1;
  __l_92._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_92,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x67,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"|",&local_126);
  __l_93._M_len = 1;
  __l_93._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_93,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x68,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"[",&local_126);
  __l_94._M_len = 1;
  __l_94._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_94,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x69,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"]",&local_126);
  __l_95._M_len = 1;
  __l_95._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_95,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x6a,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"{",&local_126);
  __l_96._M_len = 1;
  __l_96._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_96,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x6b,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"}",&local_126);
  __l_97._M_len = 1;
  __l_97._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_97,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x6c,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,">",&local_126);
  __l_98._M_len = 1;
  __l_98._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_98,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x6d,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,",",&local_126);
  __l_99._M_len = 1;
  __l_99._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_99,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x6e,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"%",&local_126);
  __l_x00100._M_len = 1;
  __l_x00100._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_x00100,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x6f,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"!",&local_126);
  __l_x00101._M_len = 1;
  __l_x00101._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_x00101,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x70,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"common",&local_125);
  std::__cxx11::string::string((string *)&local_120,"OTHERCHAR",&local_126);
  __l_x00102._M_len = 1;
  __l_x00102._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_x00102,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x71,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)local_e0,"WS*",(allocator *)&local_120);
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x72,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::string((string *)&local_120,"WS*",&local_125);
  std::__cxx11::string::string((string *)local_e0,"WS*",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS",(allocator *)&local_127);
  __l_x00103._M_len = 2;
  __l_x00103._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_x00103,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x73,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_e0,"WS+",&local_125);
  std::__cxx11::string::string((string *)&local_120,"WS",&local_126);
  __l_x00104._M_len = 1;
  __l_x00104._M_array = &local_120.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l_x00104,&local_127);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x74,(Production *)local_e0);
  Language::Production::~Production((Production *)local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"WS+",&local_125);
  std::__cxx11::string::string((string *)local_e0,"WS+",&local_126);
  std::__cxx11::string::string((string *)&local_c0,"WS",(allocator *)&local_127);
  __l_x00105._M_len = 2;
  __l_x00105._M_array = (iterator)local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_120.rhs,__l_x00105,&local_124);
  Language::Production::operator=
            ((prods->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x75,&local_120);
  Language::Production::~Production(&local_120);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_e0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

static void build_productions(std::vector<Language::Production>& prods) {
  prods.resize(NPRODS);
  prods[PROD_DOC] = {"doc", {"top_items"}};
  prods[PROD_DOC2] = {"doc", {"NEWLINE", "top_items"}};
  prods[PROD_TOP_FIRST] = {"top_items", {"top_item"}};
  prods[PROD_TOP_NEXT] = {"top_items", {"top_items", "top_item"}};
  prods[PROD_TOP_DIRECT] = {"top_item", {"%", "any*", "NEWLINE"}};
  prods[PROD_TOP_BEGIN] = {"top_item", {"-", "-", "-", "NEWLINE"}};
  prods[PROD_TOP_END] = {"top_item", {".", ".", ".", "NEWLINE"}};
  prods[PROD_TOP_BMAP] = {"top_item", {"bmap_item"}};
  prods[PROD_BMAP_FIRST] = {"bmap_items", {"bmap_item"}};
  prods[PROD_BMAP_NEXT] = {"bmap_items", {"bmap_items", "bmap_item"}};
  prods[PROD_BMAP_SCALAR] = {
      "bmap_item", {"scalar", ":", "WS*", "tag?", "map_scalar", "NEWLINE"}};
  prods[PROD_BMAP_BSCALAR] = {"bmap_item", {"scalar", ":", "WS*", "bscalar"}};
  prods[PROD_BMAP_BVALUE] = {
      "bmap_item", {"scalar", ":", "WS*", "NEWLINE", "bvalue"}};
  prods[PROD_BVALUE_EMPTY] = {"bvalue", {}};
  prods[PROD_BVALUE_BMAP] = {"bvalue", {"INDENT", "bmap_items", "DEDENT"}};
  /* TODO: allow a tag in this */
  prods[PROD_BVALUE_BSEQ] = {"bvalue", {"INDENT", "bseq_items", "DEDENT"}};
  prods[PROD_BMAP_FMAP] = {
      "bmap_item", {"scalar", ":", "WS*", "tag?", "fmap", "NEWLINE"}};
  prods[PROD_BMAP_FSEQ] = {
      "bmap_item", {"scalar", ":", "WS*", "tag?", "fseq", "NEWLINE"}};
  prods[PROD_BSEQ_FIRST] = {"bseq_items", {"bseq_item"}};
  prods[PROD_BSEQ_NEXT] = {"bseq_items", {"bseq_items", "bseq_item"}};
  prods[PROD_BSEQ_SCALAR] = {
      "bseq_item", {"-", "WS+", "tag?", "scalar", "NEWLINE"}};
  prods[PROD_BSEQ_BSCALAR] = {"bseq_item", {"-", "WS+", "bscalar"}};
  prods[PROD_BSEQ_BMAP] = {
      "bseq_item", {"-", "NEWLINE", "INDENT", "bmap_items", "DEDENT"}};
  prods[PROD_BSEQ_BMAP_TRAIL] = {
      "bseq_item", {"-", "WS+", "NEWLINE", "INDENT", "bmap_items", "DEDENT"}};
  prods[PROD_BSEQ_BSEQ] = {
      "bseq_item", {"-", "NEWLINE", "INDENT", "bseq_items", "DEDENT"}};
  prods[PROD_BSEQ_BSEQ_TRAIL] = {
      "bseq_item", {"-", "WS+", "NEWLINE", "INDENT", "bseq_items", "DEDENT"}};
  prods[PROD_BSEQ_FMAP] = {
      "bseq_item", {"-", "WS+", "tag?", "fmap", "NEWLINE"}};
  prods[PROD_BSEQ_FSEQ] = {
      "bseq_item", {"-", "WS+", "tag?", "fseq", "NEWLINE"}};
  prods[PROD_FMAP] = {"fmap", {"{", "WS*", "fmap_items", "}", "WS*"}};
  prods[PROD_FMAP_EMPTY] = {"fmap", {"{", "WS*", "}", "WS*"}};
  prods[PROD_FMAP_FIRST] = {"fmap_items", {"fmap_item"}};
  prods[PROD_FMAP_NEXT] = {
      "fmap_items", {"fmap_items", ",", "WS*", "fmap_item"}};
  prods[PROD_FMAP_SCALAR] = {
      "fmap_item", {"scalar", ":", "WS*", "tag?", "scalar"}};
  prods[PROD_FMAP_FMAP] = {"fmap_item", {"scalar", ":", "WS*", "tag?", "fmap"}};
  prods[PROD_FMAP_FSEQ] = {"fmap_item", {"scalar", ":", "WS*", "tag?", "fseq"}};
  prods[PROD_FSEQ] = {"fseq", {"[", "WS*", "fseq_items", "]", "WS*"}};
  prods[PROD_FSEQ_EMPTY] = {"fseq", {"[", "WS*", "]", "WS*"}};
  prods[PROD_FSEQ_FIRST] = {"fseq_items", {"fseq_item"}};
  prods[PROD_FSEQ_NEXT] = {
      "fseq_items", {"fseq_items", ",", "WS*", "fseq_item"}};
  prods[PROD_FSEQ_SCALAR] = {"fseq_item", {"tag?", "scalar"}};
  prods[PROD_FSEQ_FMAP] = {"fseq_item", {"tag?", "fmap"}};
  prods[PROD_FSEQ_FSEQ] = {"fseq_item", {"tag?", "fseq"}};
  prods[PROD_SCALAR_RAW] = {"scalar", {"scalar_head", "scalar_tail*"}};
  prods[PROD_SCALAR_QUOTED] = {"scalar", {"scalar_quoted"}};
  prods[PROD_MAP_SCALAR_RAW] = {
      "map_scalar", {"scalar_head", "scalar_tail*", "map_scalar_escaped*"}};
  prods[PROD_MAP_SCALAR_QUOTED] = {"map_scalar", {"scalar_quoted"}};
  prods[PROD_SCALAR_DQUOTED] = {
      "scalar_quoted", {"\"", "dquoted*", "descape*", "\"", "WS*"}};
  prods[PROD_SCALAR_SQUOTED] = {
      "scalar_quoted", {"'", "squoted*", "sescape*", "'", "WS*"}};
  prods[PROD_SCALAR_HEAD_OTHER] = {"scalar_head", {"OTHERCHAR"}};
  prods[PROD_SCALAR_HEAD_DOT] = {"scalar_head", {".", "OTHERCHAR"}};
  prods[PROD_SCALAR_HEAD_DASH] = {"scalar_head", {"-", "OTHERCHAR"}};
  prods[PROD_SCALAR_HEAD_DOT_DOT] = {"scalar_head", {".", ".", "OTHERCHAR"}};
  prods[PROD_MAP_SCALAR_ESCAPED_EMPTY] = {"map_scalar_escaped*", {}};
  prods[PROD_MAP_SCALAR_ESCAPED_NEXT] = {
      "map_scalar_escaped*", {"map_scalar_escaped*", ",", "scalar_tail*"}};
  prods[PROD_TAG_EMPTY] = {"tag?", {}};
  prods[PROD_TAG] = {"tag?", {"!", "!", "OTHERCHAR+", "WS+"}};
  prods[PROD_BSCALAR] = {"bscalar", {"bscalar_header", "WS*", "NEWLINE",
                                        "INDENT", "bscalar_items", "DEDENT"}};
  prods[PROD_BSCALAR_FIRST] = {"bscalar_items", {"bscalar_item"}};
  prods[PROD_BSCALAR_NEXT] = {
      "bscalar_items", {"bscalar_items", "bscalar_item"}};
  prods[PROD_BSCALAR_LINE] = {"bscalar_item", {"any*", "NEWLINE"}};
  prods[PROD_BSCALAR_INDENT] = {
      "bscalar_item", {"INDENT", "bscalar_items", "DEDENT"}};
  prods[PROD_BSCALAR_HEADER_LITERAL] = {
      "bscalar_header", {"|", "bscalar_head_c*"}};
  prods[PROD_BSCALAR_HEADER_FOLDED] = {
      "bscalar_header", {">", "bscalar_head_c*"}};
  prods[PROD_BSCALAR_HEAD_EMPTY] = {"bscalar_head_c*", {}};
  prods[PROD_BSCALAR_HEAD_NEXT] = {
      "bscalar_head_c*", {"bscalar_head_c*", "bscalar_head_c"}};
  prods[PROD_BSCALAR_HEAD_OTHER] = {"bscalar_head_c", {"OTHERCHAR"}};
  prods[PROD_BSCALAR_HEAD_DASH] = {"bscalar_head_c", {"-"}};
  prods[PROD_DQUOTED_EMPTY] = {"dquoted*", {}};
  prods[PROD_DQUOTED_NEXT] = {"dquoted*", {"dquoted*", "dquoted"}};
  prods[PROD_SQUOTED_EMPTY] = {"squoted*", {}};
  prods[PROD_SQUOTED_NEXT] = {"squoted*", {"squoted*", "squoted"}};
  prods[PROD_ANY_EMPTY] = {"any*", {}};
  prods[PROD_ANY_NEXT] = {"any*", {"any*", "any"}};
  prods[PROD_DESCAPE_EMPTY] = {"descape*", {}};
  prods[PROD_DESCAPE_NEXT] = {"descape*", {"descape*", "descape"}};
  prods[PROD_DESCAPE] = {"descape", {"\\", "descaped", "dquoted*"}};
  prods[PROD_SESCAPE_EMPTY] = {"sescape*", {}};
  prods[PROD_SESCAPE_NEXT] = {"sescape*", {"sescape*", "sescape"}};
  prods[PROD_SESCAPE] = {"sescape", {"'", "'", "squoted*"}};
  prods[PROD_SCALAR_TAIL_EMPTY] = {"scalar_tail*", {}};
  prods[PROD_SCALAR_TAIL_NEXT] = {
      "scalar_tail*", {"scalar_tail*", "scalar_tail"}};
  prods[PROD_OTHER_FIRST] = {"OTHERCHAR+", {"OTHERCHAR"}};
  prods[PROD_OTHER_NEXT] = {"OTHERCHAR+", {"OTHERCHAR+", "OTHERCHAR"}};
  prods[PROD_SCALAR_TAIL_SPACE] = {"scalar_tail", {"WS"}};
  prods[PROD_SCALAR_TAIL_DOT] = {"scalar_tail", {"."}};
  prods[PROD_SCALAR_TAIL_DASH] = {"scalar_tail", {"-"}};
  prods[PROD_SCALAR_TAIL_SQUOT] = {"scalar_tail", {"'"}};
  prods[PROD_SCALAR_TAIL_OTHER] = {"scalar_tail", {"OTHERCHAR"}};
  prods[PROD_DESCAPED_DQUOT] = {"descaped", {"\""}};
  prods[PROD_DESCAPED_SLASH] = {"descaped", {"\\"}};
  prods[PROD_DESCAPED_DQUOTED] = {"descaped", {"dquoted"}};
  prods[PROD_DQUOTED_COMMON] = {"dquoted", {"common"}};
  prods[PROD_DQUOTED_SQUOT] = {"dquoted", {"'"}};
  prods[PROD_SQUOTED_COMMON] = {"squoted", {"common"}};
  prods[PROD_SQUOTED_DQUOT] = {"squoted", {"\""}};
  prods[PROD_SQUOTED_SLASH] = {"squoted", {"\\"}};
  prods[PROD_ANY_COMMON] = {"any", {"common"}};
  prods[PROD_ANY_DQUOT] = {"any", {"\""}};
  prods[PROD_ANY_SQUOT] = {"any", {"'"}};
  prods[PROD_ANY_SLASH] = {"any", {"\\"}};
  prods[PROD_COMMON_SPACE] = {"common", {"WS"}};
  prods[PROD_COMMON_COLON] = {"common", {":"}};
  prods[PROD_COMMON_DOT] = {"common", {"."}};
  prods[PROD_COMMON_DASH] = {"common", {"-"}};
  prods[PROD_COMMON_PIPE] = {"common", {"|"}};
  prods[PROD_COMMON_LSQUARE] = {"common", {"["}};
  prods[PROD_COMMON_RSQUARE] = {"common", {"]"}};
  prods[PROD_COMMON_LCURLY] = {"common", {"{"}};
  prods[PROD_COMMON_RCURLY] = {"common", {"}"}};
  prods[PROD_COMMON_RANGLE] = {"common", {">"}};
  prods[PROD_COMMON_COMMA] = {"common", {","}};
  prods[PROD_COMMON_PERCENT] = {"common", {"%"}};
  prods[PROD_COMMON_EXCL] = {"common", {"!"}};
  prods[PROD_COMMON_OTHER] = {"common", {"OTHERCHAR"}};
  prods[PROD_SPACE_STAR_EMPTY] = {"WS*", {}};
  prods[PROD_SPACE_STAR_NEXT] = {"WS*", {"WS*", "WS"}};
  prods[PROD_SPACE_PLUS_FIRST] = {"WS+", {"WS"}};
  prods[PROD_SPACE_PLUS_NEXT] = {"WS+", {"WS+", "WS"}};
}